

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O0

void __thiscall
lf::io::VtkWriter::VtkWriter
          (VtkWriter *this,shared_ptr<const_lf::mesh::Mesh> *mesh,string *filename,dim_t codim,
          uchar order)

{
  double dVar1;
  Entity *pEVar2;
  bool bVar3;
  RefElType RVar4;
  RefElType RVar5;
  uint uVar6;
  dim_t dVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  CodimMeshDataSet<unsigned_int> *this_00;
  element_type *peVar11;
  reference pvVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Scalar *pSVar13;
  Scalar *pSVar14;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference this_01;
  undefined4 extraout_var_03;
  reference ppEVar15;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Index IVar16;
  Matrix<float,3,1,0,3,1> *this_02;
  reference pvVar17;
  uint *puVar18;
  reference pvVar19;
  undefined4 extraout_var_07;
  reference this_03;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  reference pOVar20;
  runtime_error *prVar21;
  reference pvVar22;
  ostream *stream;
  string local_10d8;
  allocator<char> local_10b1;
  string local_10b0;
  allocator<char> local_1089;
  string local_1088;
  stringstream local_1068 [8];
  stringstream ss_4;
  ostream local_1058 [381];
  RefEl local_edb;
  RefEl local_eda;
  RefEl local_ed9;
  value_type_conflict2 local_ed8;
  RefElType local_ed1;
  uint local_ed0;
  uint local_ecc;
  uint i_1;
  uint offset;
  allocator<char> local_ea1;
  string local_ea0;
  allocator<char> local_e79;
  string local_e78;
  stringstream local_e58 [8];
  stringstream ss_3;
  ostream local_e48 [376];
  span<const_lf::mesh::Orientation,_18446744073709551615UL> local_cd0;
  __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
  local_cc0;
  iterator o_iterator_1;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_ca8;
  iterator iterator_1;
  __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
  local_c90;
  iterator o_iterator;
  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
  local_c78;
  iterator iterator;
  anon_class_32_4_86b0970c addSegmentNodes;
  Entity *p_1;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  value_type *node_indices;
  RefEl ref_el_2;
  Entity *pEStack_c08;
  size_type index_1;
  Entity *e_1;
  iterator __end2_2;
  iterator __begin2_2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2_2;
  RefEl local_bd0;
  RefElType local_bcf;
  RefElType local_bce;
  RefEl local_bcd;
  uint points_per_segment;
  undefined1 auStack_bc8 [8];
  array<unsigned_int,_5UL> num_nodes;
  long local_b78;
  Index i;
  Type local_b58;
  RowXpr local_b48;
  Type local_b10;
  Matrix<double,__1,__1,_0,__1,__1> local_ad8;
  Type local_ac0;
  RowXpr local_ab0;
  RowXpr local_a78;
  RowXpr local_a40;
  Matrix<double,__1,__1,_0,__1,__1> local_a08;
  Type local_9f0;
  RefElType local_9d9;
  uint local_9d8 [2];
  undefined1 local_9d0 [8];
  MatrixXf coords;
  RefEl ref_el_1;
  Entity *e;
  iterator __end4;
  iterator __begin4;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range4;
  undefined1 local_978 [3];
  char cd;
  size_type index_offset;
  Matrix<double,__1,__1,_0,__1,__1> local_960;
  Type local_948;
  Type local_938;
  Matrix<double,__1,__1,_0,__1,__1> local_908;
  Matrix<double,__1,__1,_0,__1,__1> local_8f0;
  Type local_8d8;
  Matrix<double,__1,__1,_0,__1,__1> local_8c8;
  Matrix<double,__1,__1,_0,__1,__1> local_8b0;
  undefined1 local_898 [8];
  Vector3f coord;
  size_type index;
  Entity *p;
  iterator __end2_1;
  iterator __begin2_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2_1;
  Matrix<double,_0,_1,_0,_0,_1> zero;
  const_iterator pRStack_850;
  RefEl ref_el;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<lf::base::RefEl> local_838;
  initializer_list<lf::base::RefEl> *local_828;
  initializer_list<lf::base::RefEl> *__range2;
  uint numNodes;
  RefEl local_7f9;
  MatrixXd local_7f8;
  RefEl local_7d9;
  MatrixXd local_7d8;
  allocator<char> local_7b9;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  allocator<char> local_769;
  string local_768;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  stringstream local_6d8 [8];
  stringstream ss_2;
  ostream local_6c8 [383];
  allocator<char> local_549;
  string local_548;
  allocator<char> local_521;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  stringstream local_468 [8];
  stringstream ss_1;
  ostream local_458 [383];
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  string local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  stringstream local_1f8 [8];
  stringstream ss;
  ostream local_1e8 [380];
  uint local_6c;
  undefined1 local_68 [4];
  uint dim_world;
  uint dim_mesh;
  shared_ptr<const_lf::mesh::Mesh> local_50 [2];
  byte local_25;
  dim_t local_24;
  uchar order_local;
  string *psStack_20;
  dim_t codim_local;
  string *filename_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_local;
  VtkWriter *this_local;
  
  local_25 = order;
  local_24 = codim;
  psStack_20 = filename;
  filename_local = (string *)mesh;
  mesh_local = &this->mesh_;
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&this->mesh_,mesh);
  VtkFile::VtkFile(&this->vtk_file_);
  std::__cxx11::string::string((string *)&this->filename_,filename);
  this->codim_ = local_24;
  this->order_ = local_25;
  std::array<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5UL>::array(&this->aux_nodes_);
  dim_world._3_1_ = 1;
  local_50[1].super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&this->aux_node_offset_;
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(local_50,&this->mesh_);
  lf::mesh::utils::CodimMeshDataSet<unsigned_int>::CodimMeshDataSet
            ((this->aux_node_offset_)._M_elems,local_50,0);
  this_00 = (this->aux_node_offset_)._M_elems + 1;
  local_50[1].super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr
            ((shared_ptr<const_lf::mesh::Mesh> *)&dim_mesh,&this->mesh_);
  lf::mesh::utils::CodimMeshDataSet<unsigned_int>::CodimMeshDataSet
            (this_00,(shared_ptr<const_lf::mesh::Mesh> *)&dim_mesh,1);
  dim_world._3_1_ = 0;
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)&dim_mesh);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(local_50);
  peVar11 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  local_68 = (undefined1  [4])(**peVar11->_vptr_Mesh)();
  peVar11 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  local_6c = (*peVar11->_vptr_Mesh[1])();
  if ((local_6c == 0) || (4 < local_6c)) {
    std::__cxx11::stringstream::stringstream(local_1f8);
    std::operator<<(local_1e8,"VtkWriter supports only dim_world = 1,2 or 3");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"dim_world > 0 && dim_world <= 4",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
               ,&local_241);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_218,&local_240,0x24c,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator(&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"false",&local_289);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
               ,&local_2b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"",&local_2d9);
    lf::base::AssertionFailed(&local_288,&local_2b0,0x24c,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    abort();
  }
  if ((uint)local_68 <= local_24) {
    std::__cxx11::stringstream::stringstream(local_468);
    std::operator<<(local_458,"codim out of bounds.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,"codim >= 0 && codim < dim_mesh",&local_489);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
               ,&local_4b1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_488,&local_4b0,0x24d,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator(&local_4b1);
    std::__cxx11::string::~string((string *)&local_488);
    std::allocator<char>::~allocator(&local_489);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f8,"false",&local_4f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_520,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
               ,&local_521);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"",&local_549);
    lf::base::AssertionFailed(&local_4f8,&local_520,0x24d,&local_548);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator(&local_549);
    std::__cxx11::string::~string((string *)&local_520);
    std::allocator<char>::~allocator(&local_521);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator(&local_4f9);
    abort();
  }
  if ((local_25 != 0) && (local_25 < 0xb)) {
    if (1 < this->order_) {
      anon_unknown_1::AuxNodesSegment(&local_7d8,local_25);
      local_7d9 = lf::base::RefEl::kSegment();
      uVar6 = lf::base::RefEl::Id(&local_7d9);
      pvVar12 = std::array<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5UL>::operator[]
                          (&this->aux_nodes_,(ulong)uVar6);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(pvVar12,&local_7d8);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_7d8);
      anon_unknown_1::AuxNodesTria(&local_7f8,local_25);
      local_7f9 = lf::base::RefEl::kTria();
      uVar6 = lf::base::RefEl::Id(&local_7f9);
      pvVar12 = std::array<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5UL>::operator[]
                          (&this->aux_nodes_,(ulong)uVar6);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(pvVar12,&local_7f8);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_7f8);
      anon_unknown_1::AuxNodesQuad((MatrixXd *)&numNodes,local_25);
      __range2._7_1_ = lf::base::RefEl::kQuad();
      uVar6 = lf::base::RefEl::Id((RefEl *)((long)&__range2 + 7));
      pvVar12 = std::array<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5UL>::operator[]
                          (&this->aux_nodes_,(ulong)uVar6);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
                (pvVar12,(Matrix<double,__1,__1,_0,__1,__1> *)&numNodes);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)&numNodes);
    }
    peVar11 = std::
              __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    __range2._0_4_ = (*peVar11->_vptr_Mesh[3])(peVar11,(ulong)(uint)local_68);
    __begin2._5_1_ = lf::base::RefEl::kSegment();
    __begin2._6_1_ = lf::base::RefEl::kTria();
    __begin2._7_1_ = lf::base::RefEl::kQuad();
    local_838._M_array = (iterator)((long)&__begin2 + 5);
    local_838._M_len = 3;
    local_828 = &local_838;
    __end2 = std::initializer_list<lf::base::RefEl>::begin(local_828);
    pRStack_850 = std::initializer_list<lf::base::RefEl>::end(local_828);
    for (; __end2 != pRStack_850; __end2 = __end2 + 1) {
      __range2_1._7_1_ = (RefEl)__end2->type_;
      dVar7 = lf::base::RefEl::Dimension((RefEl *)((long)&__range2_1 + 7));
      if (dVar7 <= (int)local_68 - this->codim_) {
        __range2_1._6_1_ = __range2_1._7_1_;
        uVar6 = anon_unknown_1::NumAuxNodes(__range2_1._7_1_,this->order_);
        peVar11 = std::
                  __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        __range2_1._5_1_ = __range2_1._7_1_;
        iVar8 = (*peVar11->_vptr_Mesh[4])(peVar11,(ulong)__range2_1._7_1_);
        __range2._0_4_ = uVar6 * iVar8 + (uint)__range2;
      }
    }
    std::
    vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
    ::resize(&(this->vtk_file_).unstructured_grid.points,(ulong)(uint)__range2);
    Eigen::Matrix<double,_0,_1,_0,_0,_1>::Matrix
              ((Matrix<double,_0,_1,_0,_0,_1> *)((long)&__range2_1 + 4));
    peVar11 = std::
              __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    iVar8 = (*peVar11->_vptr_Mesh[2])(peVar11,(ulong)(uint)local_68);
    __begin2_1._M_current = (Entity **)CONCAT44(extraout_var,iVar8);
    __end2_1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_1
                         );
    p = (Entity *)
        std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                  ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_1);
    while (bVar3 = __gnu_cxx::
                   operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                             (&__end2_1,
                              (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                               *)&p), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppEVar15 = __gnu_cxx::
                 __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                 ::operator*(&__end2_1);
      unique0x00012000 = *ppEVar15;
      peVar11 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      coord.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
           (float)(*peVar11->_vptr_Mesh[5])(peVar11,stack0xfffffffffffff778);
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_898);
      if (local_6c == 1) {
        iVar8 = (*stack0xfffffffffffff778->_vptr_Entity[3])();
        Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,0,1,0,0,1>>
                  ((Matrix<double,_1,_1,0,_1,_1> *)&local_8c8,
                   (EigenBase<Eigen::Matrix<double,_0,_1,_0,_0,_1>_> *)((long)&__range2_1 + 4));
        (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar8) + 0x18))
                  (&local_8b0,(long *)CONCAT44(extraout_var_00,iVar8),&local_8c8);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                             &local_8b0,0);
        dVar1 = *pSVar13;
        pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_898,0)
        ;
        *pSVar14 = (float)dVar1;
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_8b0);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_8c8);
        pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_898,1)
        ;
        *pSVar14 = 0.0;
        pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_898,2)
        ;
        *pSVar14 = 0.0;
      }
      else if (local_6c == 2) {
        iVar8 = (*stack0xfffffffffffff778->_vptr_Entity[3])();
        Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,0,1,0,0,1>>
                  ((Matrix<double,_1,_1,0,_1,_1> *)&local_908,
                   (EigenBase<Eigen::Matrix<double,_0,_1,_0,_0,_1>_> *)((long)&__range2_1 + 4));
        (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar8) + 0x18))
                  (&local_8f0,(long *)CONCAT44(extraout_var_01,iVar8),&local_908);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cast<float>
                  (&local_8d8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_8f0);
        Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::topRows<2>
                  (&local_938,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_898,2);
        Eigen::Block<Eigen::Matrix<float,3,1,0,3,1>,2,1,false>::operator=
                  ((Block<Eigen::Matrix<float,3,1,0,3,1>,2,1,false> *)&local_938,
                   (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<double,_float>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_8d8);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_8f0);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_908);
        pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_898,2)
        ;
        *pSVar14 = 0.0;
      }
      else {
        iVar8 = (*stack0xfffffffffffff778->_vptr_Entity[3])();
        Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,0,1,0,0,1>>
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_978,
                   (EigenBase<Eigen::Matrix<double,_0,_1,_0,_0,_1>_> *)((long)&__range2_1 + 4));
        (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar8) + 0x18))
                  (&local_960,(long *)CONCAT44(extraout_var_02,iVar8),local_978);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cast<float>
                  (&local_948,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_960);
        Eigen::Matrix<float,3,1,0,3,1>::operator=
                  ((Matrix<float,3,1,0,3,1> *)local_898,
                   (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<double,_float>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_948);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_960);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_978);
      }
      this_01 = std::
                vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ::operator[](&(this->vtk_file_).unstructured_grid.points,
                             (ulong)(uint)coord.
                                          super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                                          .m_storage.m_data.array[1]);
      Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=
                (this_01,(Matrix<float,_3,_1,_0,_3,_1> *)local_898);
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end2_1);
    }
    if (1 < local_25) {
      peVar11 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      __range4._4_4_ = (*peVar11->_vptr_Mesh[3])(peVar11,(ulong)(uint)local_68);
      __range4._3_1_ = local_68[0];
      while (__range4._3_1_ = __range4._3_1_ + -1, (char)local_24 <= __range4._3_1_) {
        peVar11 = std::
                  __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        iVar8 = (*peVar11->_vptr_Mesh[2])(peVar11,(ulong)(uint)(int)__range4._3_1_);
        __begin4._M_current = (Entity **)CONCAT44(extraout_var_03,iVar8);
        __end4 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin4
                           );
        e = (Entity *)
            std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                      ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin4);
        while (bVar3 = __gnu_cxx::
                       operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                 (&__end4,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                           *)&e), ((bVar3 ^ 0xffU) & 1) != 0) {
          ppEVar15 = __gnu_cxx::
                     __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                     ::operator*(&__end4);
          pEVar2 = *ppEVar15;
          iVar8 = (*pEVar2->_vptr_Entity[4])();
          coords.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
          _7_1_ = (RefElType)iVar8;
          RVar4 = lf::base::RefEl::operator_cast_to_RefElType
                            ((RefEl *)((long)&coords.
                                              super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                                              .m_storage.m_cols + 7));
          coords.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
          _6_1_ = lf::base::RefEl::kTria();
          RVar5 = lf::base::RefEl::operator_cast_to_RefElType
                            ((RefEl *)((long)&coords.
                                              super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                                              .m_storage.m_cols + 6));
          if (RVar4 != RVar5 || 2 < local_25) {
            local_9d8[1] = 3;
            local_9d9 = coords.super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols._7_1_;
            local_9d8[0] = anon_unknown_1::NumAuxNodes
                                     (coords.
                                      super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                                      .m_storage.m_cols._7_1_,local_25);
            Eigen::Matrix<float,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
                      ((Matrix<float,_1,_1,0,_1,_1> *)local_9d0,(int *)(local_9d8 + 1),local_9d8);
            if (local_6c == 1) {
              iVar8 = (*pEVar2->_vptr_Entity[3])();
              uVar6 = lf::base::RefEl::Id((RefEl *)((long)&coords.
                                                  super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols + 7));
              pvVar12 = std::array<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5UL>::operator[]
                                  (&this->aux_nodes_,(ulong)uVar6);
              (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar8) + 0x18))
                        (&local_a08,(long *)CONCAT44(extraout_var_04,iVar8),pvVar12);
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cast<float>
                        (&local_9f0,
                         (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_a08);
              Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::row
                        (&local_a40,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_9d0
                         ,0);
              Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,1,-1,false>::operator=
                        ((Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,1,_1,false> *)&local_a40,
                         (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<double,_float>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          *)&local_9f0);
              Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_a08);
              Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::row
                        (&local_a78,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_9d0
                         ,1);
              Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
              ::setZero((DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                         *)&local_a78);
              Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::row
                        (&local_ab0,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_9d0
                         ,2);
              Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
              ::setZero((DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                         *)&local_ab0);
            }
            else if (local_6c == 2) {
              iVar8 = (*pEVar2->_vptr_Entity[3])();
              uVar6 = lf::base::RefEl::Id((RefEl *)((long)&coords.
                                                  super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols + 7));
              pvVar12 = std::array<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5UL>::operator[]
                                  (&this->aux_nodes_,(ulong)uVar6);
              (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar8) + 0x18))
                        (&local_ad8,(long *)CONCAT44(extraout_var_05,iVar8),pvVar12);
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cast<float>
                        (&local_ac0,
                         (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_ad8);
              Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::topRows<int>
                        (&local_b10,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_9d0
                         ,2);
              Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                        ((Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false> *)&local_b10,
                         (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<double,_float>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          *)&local_ac0);
              Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_ad8);
              Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::row
                        (&local_b48,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_9d0
                         ,2);
              Eigen::DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
              ::setZero((DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                         *)&local_b48);
            }
            else {
              iVar8 = (*pEVar2->_vptr_Entity[3])();
              uVar6 = lf::base::RefEl::Id((RefEl *)((long)&coords.
                                                  super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols + 7));
              pvVar12 = std::array<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5UL>::operator[]
                                  (&this->aux_nodes_,(ulong)uVar6);
              (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar8) + 0x18))
                        (&i,(long *)CONCAT44(extraout_var_06,iVar8),pvVar12);
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cast<float>
                        (&local_b58,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&i);
              Eigen::Matrix<float,-1,-1,0,-1,-1>::operator=
                        ((Matrix<float,_1,_1,0,_1,_1> *)local_9d0,
                         (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<double,_float>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          *)&local_b58);
              Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                        ((Matrix<double,__1,__1,_0,__1,__1> *)&i);
            }
            for (local_b78 = 0;
                IVar16 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                                   ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
                                    local_9d0), local_b78 < IVar16; local_b78 = local_b78 + 1) {
              Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::col
                        ((ColXpr *)(num_nodes._M_elems + 4),
                         (DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)local_9d0,local_b78)
              ;
              this_02 = (Matrix<float,3,1,0,3,1> *)
                        std::
                        vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                        ::operator[](&(this->vtk_file_).unstructured_grid.points,
                                     (ulong)__range4._4_4_ + local_b78);
              Eigen::Matrix<float,3,1,0,3,1>::operator=
                        (this_02,(DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                                  *)(num_nodes._M_elems + 4));
            }
            pvVar17 = std::array<lf::mesh::utils::CodimMeshDataSet<unsigned_int>,_2UL>::operator[]
                                (&this->aux_node_offset_,(long)__range4._3_1_);
            puVar18 = lf::mesh::utils::CodimMeshDataSet<unsigned_int>::operator()(pvVar17,pEVar2);
            *puVar18 = __range4._4_4_;
            IVar16 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                               ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)
                                local_9d0);
            __range4._4_4_ = __range4._4_4_ + (int)IVar16;
            Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<float,__1,__1,_0,__1,__1> *)local_9d0);
          }
          __gnu_cxx::
          __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
          ::operator++(&__end4);
        }
      }
    }
    auStack_bc8._0_4_ = 0;
    auStack_bc8._4_4_ = 0;
    num_nodes._M_elems[0] = 0;
    num_nodes._M_elems[1] = 0;
    num_nodes._M_elems[2] = 0;
    points_per_segment._3_1_ = lf::base::RefEl::kSegment();
    uVar6 = anon_unknown_1::NumAuxNodes(points_per_segment._3_1_,local_25);
    points_per_segment._2_1_ = lf::base::RefEl::kSegment();
    uVar9 = lf::base::RefEl::Id((RefEl *)((long)&points_per_segment + 2));
    pvVar19 = std::array<unsigned_int,_5UL>::operator[]
                        ((array<unsigned_int,_5UL> *)auStack_bc8,(ulong)uVar9);
    *pvVar19 = uVar6 + 2;
    points_per_segment._1_1_ = lf::base::RefEl::kSegment();
    uVar6 = anon_unknown_1::NumAuxNodes(points_per_segment._1_1_,local_25);
    points_per_segment._0_1_ = lf::base::RefEl::kTria();
    uVar9 = anon_unknown_1::NumAuxNodes(points_per_segment._0_1_,local_25);
    local_bcd = lf::base::RefEl::kTria();
    uVar10 = lf::base::RefEl::Id(&local_bcd);
    pvVar19 = std::array<unsigned_int,_5UL>::operator[]
                        ((array<unsigned_int,_5UL> *)auStack_bc8,(ulong)uVar10);
    *pvVar19 = uVar6 * 3 + 3 + uVar9;
    local_bce = (RefElType)lf::base::RefEl::kSegment();
    uVar6 = anon_unknown_1::NumAuxNodes((RefEl)local_bce,local_25);
    local_bcf = (RefElType)lf::base::RefEl::kQuad();
    uVar9 = anon_unknown_1::NumAuxNodes((RefEl)local_bcf,local_25);
    local_bd0 = lf::base::RefEl::kQuad();
    uVar10 = lf::base::RefEl::Id(&local_bd0);
    pvVar19 = std::array<unsigned_int,_5UL>::operator[]
                        ((array<unsigned_int,_5UL> *)auStack_bc8,(ulong)uVar10);
    *pvVar19 = uVar6 * 4 + 4 + uVar9;
    peVar11 = std::
              __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    uVar6 = (*peVar11->_vptr_Mesh[3])(peVar11,(ulong)local_24);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize(&(this->vtk_file_).unstructured_grid.cells,(ulong)uVar6);
    peVar11 = std::
              __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    uVar6 = (*peVar11->_vptr_Mesh[3])(peVar11,(ulong)local_24);
    std::vector<lf::io::VtkFile::CellType,_std::allocator<lf::io::VtkFile::CellType>_>::resize
              (&(this->vtk_file_).unstructured_grid.cell_types,(ulong)uVar6);
    __range2_2._3_1_ = lf::base::RefEl::kSegment();
    __range2_2._4_4_ = anon_unknown_1::NumAuxNodes(__range2_2._3_1_,local_25);
    peVar11 = std::
              __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    iVar8 = (*peVar11->_vptr_Mesh[2])(peVar11,(ulong)local_24);
    __begin2_2._M_current = (Entity **)CONCAT44(extraout_var_07,iVar8);
    __end2_2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_2
                         );
    e_1 = (Entity *)
          std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_2);
    do {
      bVar3 = __gnu_cxx::
              operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                        (&__end2_2,
                         (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                          *)&e_1);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        return;
      }
      ppEVar15 = __gnu_cxx::
                 __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                 ::operator*(&__end2_2);
      pEStack_c08 = *ppEVar15;
      peVar11 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      node_indices._4_4_ = (*peVar11->_vptr_Mesh[5])(peVar11,pEStack_c08);
      iVar8 = (*pEStack_c08->_vptr_Entity[4])();
      node_indices._3_1_ = (undefined1)iVar8;
      this_03 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[](&(this->vtk_file_).unstructured_grid.cells,(ulong)node_indices._4_4_);
      uVar6 = lf::base::RefEl::Id((RefEl *)((long)&node_indices + 3));
      pvVar19 = std::array<unsigned_int,_5UL>::operator[]
                          ((array<unsigned_int,_5UL> *)auStack_bc8,(ulong)uVar6);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_03,(ulong)*pvVar19);
      iVar8 = (*pEStack_c08->_vptr_Entity[1])(pEStack_c08,(ulong)((int)local_68 - local_24));
      __begin3._M_current = (Entity **)CONCAT44(extraout_var_08,iVar8);
      __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
      p_1 = (Entity *)
            std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                      ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
      while (bVar3 = __gnu_cxx::
                     operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                               (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                         *)&p_1), ((bVar3 ^ 0xffU) & 1) != 0) {
        ppEVar15 = __gnu_cxx::
                   __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                   ::operator*(&__end3);
        pEVar2 = *ppEVar15;
        peVar11 = std::
                  __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        addSegmentNodes.node_indices._4_4_ = (*peVar11->_vptr_Mesh[5])(peVar11,pEVar2);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (this_03,(value_type_conflict2 *)((long)&addSegmentNodes.node_indices + 4));
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&__end3);
      }
      addSegmentNodes.this = (VtkWriter *)local_68;
      addSegmentNodes.dim_mesh = (uint *)((long)&__range2_2 + 4);
      iterator._M_current = (Entity **)this;
      addSegmentNodes.points_per_segment = (uint *)this_03;
      RVar4 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&node_indices + 3));
      if (RVar4 == kSegment) {
        VtkWriter::anon_class_32_4_86b0970c::operator()
                  ((anon_class_32_4_86b0970c *)&iterator,pEStack_c08,false);
      }
      else if (RVar4 == kTria) {
        iVar8 = (*pEStack_c08->_vptr_Entity[1])(pEStack_c08,1);
        o_iterator._M_current = (Orientation *)CONCAT44(extraout_var_09,iVar8);
        local_c78._M_current =
             (Entity **)
             std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&o_iterator);
        iVar8 = (*pEStack_c08->_vptr_Entity[2])();
        iterator_1._M_current = (Entity **)CONCAT44(extraout_var_10,iVar8);
        local_c90._M_current =
             (Orientation *)
             std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Orientation,_18446744073709551615UL> *)&iterator_1);
        ppEVar15 = __gnu_cxx::
                   __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                   ::operator*(&local_c78);
        pEVar2 = *ppEVar15;
        pOVar20 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
                  ::operator*(&local_c90);
        VtkWriter::anon_class_32_4_86b0970c::operator()
                  ((anon_class_32_4_86b0970c *)&iterator,pEVar2,*pOVar20 == negative);
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&local_c78);
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
        ::operator++(&local_c90);
        ppEVar15 = __gnu_cxx::
                   __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                   ::operator*(&local_c78);
        pEVar2 = *ppEVar15;
        pOVar20 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
                  ::operator*(&local_c90);
        VtkWriter::anon_class_32_4_86b0970c::operator()
                  ((anon_class_32_4_86b0970c *)&iterator,pEVar2,*pOVar20 == negative);
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&local_c78);
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
        ::operator++(&local_c90);
        ppEVar15 = __gnu_cxx::
                   __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                   ::operator*(&local_c78);
        pEVar2 = *ppEVar15;
        pOVar20 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
                  ::operator*(&local_c90);
        VtkWriter::anon_class_32_4_86b0970c::operator()
                  ((anon_class_32_4_86b0970c *)&iterator,pEVar2,*pOVar20 == negative);
      }
      else {
        if (RVar4 != kQuad) {
          std::__cxx11::stringstream::stringstream(local_e58);
          std::operator<<(local_e48,"something is wrong");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e78,"false",&local_e79);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ea0,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
                     ,&local_ea1);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_e78,&local_ea0,0x2e5,(string *)&i_1);
          std::__cxx11::string::~string((string *)&i_1);
          std::__cxx11::string::~string((string *)&local_ea0);
          std::allocator<char>::~allocator(&local_ea1);
          std::__cxx11::string::~string((string *)&local_e78);
          std::allocator<char>::~allocator(&local_e79);
          prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar21,"this code should not be reached");
          __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar8 = (*pEStack_c08->_vptr_Entity[1])(pEStack_c08,1);
        o_iterator_1._M_current = (Orientation *)CONCAT44(extraout_var_11,iVar8);
        local_ca8._M_current =
             (Entity **)
             std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&o_iterator_1
                       );
        iVar8 = (*pEStack_c08->_vptr_Entity[2])();
        local_cd0._M_ptr = (pointer)CONCAT44(extraout_var_12,iVar8);
        local_cc0._M_current =
             (Orientation *)
             std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::begin(&local_cd0);
        ppEVar15 = __gnu_cxx::
                   __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                   ::operator*(&local_ca8);
        pEVar2 = *ppEVar15;
        pOVar20 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
                  ::operator*(&local_cc0);
        VtkWriter::anon_class_32_4_86b0970c::operator()
                  ((anon_class_32_4_86b0970c *)&iterator,pEVar2,*pOVar20 == negative);
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&local_ca8);
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
        ::operator++(&local_cc0);
        ppEVar15 = __gnu_cxx::
                   __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                   ::operator*(&local_ca8);
        pEVar2 = *ppEVar15;
        pOVar20 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
                  ::operator*(&local_cc0);
        VtkWriter::anon_class_32_4_86b0970c::operator()
                  ((anon_class_32_4_86b0970c *)&iterator,pEVar2,*pOVar20 == negative);
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&local_ca8);
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
        ::operator++(&local_cc0);
        ppEVar15 = __gnu_cxx::
                   __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                   ::operator*(&local_ca8);
        pEVar2 = *ppEVar15;
        pOVar20 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
                  ::operator*(&local_cc0);
        VtkWriter::anon_class_32_4_86b0970c::operator()
                  ((anon_class_32_4_86b0970c *)&iterator,pEVar2,*pOVar20 == positive);
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&local_ca8);
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
        ::operator++(&local_cc0);
        ppEVar15 = __gnu_cxx::
                   __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                   ::operator*(&local_ca8);
        pEVar2 = *ppEVar15;
        pOVar20 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Orientation_*,_std::span<const_lf::mesh::Orientation,_18446744073709551615UL>_>
                  ::operator*(&local_cc0);
        VtkWriter::anon_class_32_4_86b0970c::operator()
                  ((anon_class_32_4_86b0970c *)&iterator,pEVar2,*pOVar20 == positive);
      }
      if (1 < (int)local_68 - local_24) {
        pvVar17 = std::array<lf::mesh::utils::CodimMeshDataSet<unsigned_int>,_2UL>::operator[]
                            (&this->aux_node_offset_,0);
        puVar18 = lf::mesh::utils::CodimMeshDataSet<unsigned_int>::operator()(pvVar17,pEStack_c08);
        local_ecc = *puVar18;
        local_ed0 = 0;
        while( true ) {
          uVar6 = local_ed0;
          iVar8 = (*pEStack_c08->_vptr_Entity[4])();
          local_ed1 = (RefElType)iVar8;
          uVar9 = anon_unknown_1::NumAuxNodes((RefEl)local_ed1,local_25);
          if (uVar9 <= uVar6) break;
          local_ed8 = local_ecc + local_ed0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_03,&local_ed8);
          local_ed0 = local_ed0 + 1;
        }
      }
      if (this->order_ == '\x01') {
        RVar4 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&node_indices + 3));
        local_ed9 = lf::base::RefEl::kSegment();
        RVar5 = lf::base::RefEl::operator_cast_to_RefElType(&local_ed9);
        if (RVar4 == RVar5) {
          pvVar22 = std::
                    vector<lf::io::VtkFile::CellType,_std::allocator<lf::io::VtkFile::CellType>_>::
                    operator[](&(this->vtk_file_).unstructured_grid.cell_types,
                               (ulong)node_indices._4_4_);
          *pvVar22 = VTK_LINE;
        }
        else {
          RVar4 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&node_indices + 3));
          local_eda = lf::base::RefEl::kTria();
          RVar5 = lf::base::RefEl::operator_cast_to_RefElType(&local_eda);
          if (RVar4 == RVar5) {
            pvVar22 = std::
                      vector<lf::io::VtkFile::CellType,_std::allocator<lf::io::VtkFile::CellType>_>
                      ::operator[](&(this->vtk_file_).unstructured_grid.cell_types,
                                   (ulong)node_indices._4_4_);
            *pvVar22 = VTK_TRIANGLE;
          }
          else {
            RVar4 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&node_indices + 3));
            local_edb = lf::base::RefEl::kQuad();
            RVar5 = lf::base::RefEl::operator_cast_to_RefElType(&local_edb);
            if (RVar4 == RVar5) {
              pvVar22 = std::
                        vector<lf::io::VtkFile::CellType,_std::allocator<lf::io::VtkFile::CellType>_>
                        ::operator[](&(this->vtk_file_).unstructured_grid.cell_types,
                                     (ulong)node_indices._4_4_);
              *pvVar22 = VTK_QUAD;
            }
          }
        }
      }
      else {
        RVar4 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&node_indices + 3));
        if (RVar4 == kSegment) {
          pvVar22 = std::
                    vector<lf::io::VtkFile::CellType,_std::allocator<lf::io::VtkFile::CellType>_>::
                    operator[](&(this->vtk_file_).unstructured_grid.cell_types,
                               (ulong)node_indices._4_4_);
          *pvVar22 = VTK_LAGRANGE_CURVE;
        }
        else if (RVar4 == kTria) {
          pvVar22 = std::
                    vector<lf::io::VtkFile::CellType,_std::allocator<lf::io::VtkFile::CellType>_>::
                    operator[](&(this->vtk_file_).unstructured_grid.cell_types,
                               (ulong)node_indices._4_4_);
          *pvVar22 = VTK_LAGRANGE_TRIANGLE;
        }
        else {
          if (RVar4 != kQuad) {
            std::__cxx11::stringstream::stringstream(local_1068);
            stream = std::operator<<(local_1058,"Unsupported RefElType ");
            lf::base::operator<<(stream,(RefEl *)((long)&node_indices + 3));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1088,"false",&local_1089);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_10b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
                       ,&local_10b1);
            std::__cxx11::stringstream::str();
            lf::base::AssertionFailed(&local_1088,&local_10b0,0x30a,&local_10d8);
            std::__cxx11::string::~string((string *)&local_10d8);
            std::__cxx11::string::~string((string *)&local_10b0);
            std::allocator<char>::~allocator(&local_10b1);
            std::__cxx11::string::~string((string *)&local_1088);
            std::allocator<char>::~allocator(&local_1089);
            prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar21,"this code should not be reached");
            __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pvVar22 = std::
                    vector<lf::io::VtkFile::CellType,_std::allocator<lf::io::VtkFile::CellType>_>::
                    operator[](&(this->vtk_file_).unstructured_grid.cell_types,
                               (ulong)node_indices._4_4_);
          *pvVar22 = VTK_LAGRANGE_QUADRILATERAL;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end2_2);
    } while( true );
  }
  std::__cxx11::stringstream::stringstream(local_6d8);
  std::operator<<(local_6c8,"order must lie in [1,10]");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"order > 0 && order <= 10",&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
             ,&local_721);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_6f8,&local_720,0x24e,&local_748);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"false",&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_790,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
             ,&local_791);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"",&local_7b9);
  lf::base::AssertionFailed(&local_768,&local_790,0x24e,&local_7b8);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator(&local_791);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  abort();
}

Assistant:

VtkWriter::VtkWriter(std::shared_ptr<const mesh::Mesh> mesh,
                     std::string filename, dim_t codim, unsigned char order)
    : mesh_(std::move(mesh)),
      filename_(std::move(filename)),
      codim_(codim),
      order_(order),
      aux_node_offset_{{{mesh_, 0}, {mesh_, 1}}} {
  auto dim_mesh = mesh_->DimMesh();
  auto dim_world = mesh_->DimWorld();
  LF_ASSERT_MSG(dim_world > 0 && dim_world <= 4,
                "VtkWriter supports only dim_world = 1,2 or 3");
  LF_ASSERT_MSG(codim >= 0 && codim < dim_mesh, "codim out of bounds.");
  LF_ASSERT_MSG(order > 0 && order <= 10, "order must lie in [1,10]");

  // initialize reference coordinates of auxilliary nodes (if order_ > 0)
  if (order_ > 1) {
    aux_nodes_[base::RefEl::kSegment().Id()] = AuxNodesSegment(order);
    aux_nodes_[base::RefEl::kTria().Id()] = AuxNodesTria(order);
    aux_nodes_[base::RefEl::kQuad().Id()] = AuxNodesQuad(order);
  }

  // calculate total number of nodes (main + auxilliary nodes)
  unsigned int numNodes = mesh_->NumEntities(dim_mesh);
  for (auto ref_el :
       {base::RefEl::kSegment(), base::RefEl::kTria(), base::RefEl::kQuad()}) {
    if (ref_el.Dimension() > dim_mesh - codim_) {
      continue;
    }
    numNodes += NumAuxNodes(ref_el, order_) * mesh_->NumEntities(ref_el);
  }

  // insert main nodes:
  vtk_file_.unstructured_grid.points.resize(numNodes);
  const Eigen::Matrix<double, 0, 1> zero;
  for (const auto* p : mesh_->Entities(dim_mesh)) {
    auto index = mesh_->Index(*p);
    Eigen::Vector3f coord;
    if (dim_world == 1) {
      coord(0) = static_cast<float>(p->Geometry()->Global(zero)(0));
      coord(1) = 0.F;
      coord(2) = 0.F;
    } else if (dim_world == 2) {
      coord.topRows<2>() = p->Geometry()->Global(zero).cast<float>();
      coord(2) = 0.F;
    } else {
      coord = p->Geometry()->Global(zero).cast<float>();
    }

    vtk_file_.unstructured_grid.points[index] = std::move(coord);
  }

  // insert auxilliary nodes:
  if (order > 1) {
    auto index_offset = mesh_->NumEntities(dim_mesh);
    for (char cd = static_cast<char>(dim_mesh - 1);
         cd >= static_cast<char>(codim); --cd) {
      for (const auto* e : mesh_->Entities(cd)) {
        auto ref_el = e->RefEl();
        if (ref_el == base::RefEl::kTria() && order < 3) {
          continue;
        }

        Eigen::MatrixXf coords(3, NumAuxNodes(ref_el, order));

        if (dim_world == 1) {
          coords.row(0) =
              e->Geometry()->Global(aux_nodes_[ref_el.Id()]).cast<float>();
          coords.row(1).setZero();
          coords.row(2).setZero();
        } else if (dim_world == 2) {
          coords.topRows(2) =
              e->Geometry()->Global(aux_nodes_[ref_el.Id()]).cast<float>();
          coords.row(2).setZero();
        } else {
          coords = e->Geometry()->Global(aux_nodes_[ref_el.Id()]).cast<float>();
        }
        for (Eigen::Index i = 0; i < coords.cols(); ++i) {
          vtk_file_.unstructured_grid.points[index_offset + i] = coords.col(i);
        }
        aux_node_offset_[cd](*e) = index_offset;
        index_offset += coords.cols();
      }
    }
  }

  // compute number of main/aux nodes for each element:
  std::array<unsigned int, 5> num_nodes{};
  num_nodes[base::RefEl::kSegment().Id()] =
      2 + NumAuxNodes(base::RefEl::kSegment(), order);
  num_nodes[base::RefEl::kTria().Id()] =
      3 + 3 * NumAuxNodes(base::RefEl::kSegment(), order) +
      NumAuxNodes(base::RefEl::kTria(), order);
  num_nodes[base::RefEl::kQuad().Id()] =
      4 + 4 * NumAuxNodes(base::RefEl::kSegment(), order) +
      NumAuxNodes(base::RefEl::kQuad(), order);

  // insert elements:
  vtk_file_.unstructured_grid.cells.resize(mesh_->NumEntities(codim));
  vtk_file_.unstructured_grid.cell_types.resize(mesh_->NumEntities(codim));
  auto points_per_segment = NumAuxNodes(base::RefEl::kSegment(), order);
  for (const auto* e : mesh_->Entities(codim)) {
    auto index = mesh_->Index(*e);
    auto ref_el = e->RefEl();
    auto& node_indices = vtk_file_.unstructured_grid.cells[index];
    node_indices.reserve(num_nodes[ref_el.Id()]);

    // node indices that make up this cell:
    for (const auto* p : e->SubEntities(dim_mesh - codim)) {
      node_indices.push_back(mesh_->Index(*p));
    }

    // node indices of segments of this cell:
    auto addSegmentNodes = [&](const mesh::Entity& s, bool invert) {
      auto start_index = aux_node_offset_[dim_mesh - 1](s);
      if (!invert) {
        for (unsigned int i = 0; i < points_per_segment; ++i) {
          node_indices.push_back(start_index + i);
        }
      } else {
        for (int i = static_cast<int>(points_per_segment - 1); i >= 0; --i) {
          node_indices.push_back(start_index + i);
        }
      }
    };
    switch (ref_el) {
      case base::RefEl::kSegment():
        addSegmentNodes(*e, false);
        break;
      case base::RefEl::kTria(): {
        auto iterator = e->SubEntities(1).begin();
        auto o_iterator = e->RelativeOrientations().begin();
        addSegmentNodes(**iterator,
                        (*o_iterator) == mesh::Orientation::negative);
        ++iterator;
        ++o_iterator;
        addSegmentNodes(**iterator,
                        (*o_iterator) == mesh::Orientation::negative);
        ++iterator;
        ++o_iterator;
        addSegmentNodes(**iterator,
                        (*o_iterator) == mesh::Orientation::negative);
        break;
      }
      case base::RefEl::kQuad(): {
        auto iterator = e->SubEntities(1).begin();
        auto o_iterator = e->RelativeOrientations().begin();
        addSegmentNodes(**iterator,
                        (*o_iterator) == mesh::Orientation::negative);
        ++iterator;
        ++o_iterator;
        addSegmentNodes(**iterator,
                        (*o_iterator) == mesh::Orientation::negative);
        ++iterator;
        ++o_iterator;
        addSegmentNodes(**iterator,
                        (*o_iterator) == mesh::Orientation::positive);
        ++iterator;
        ++o_iterator;
        addSegmentNodes(**iterator,
                        (*o_iterator) == mesh::Orientation::positive);
        break;
      }
      default:
        LF_VERIFY_MSG(false, "something is wrong");
    }

    // indices in the interior of the cell:
    if (dim_mesh - codim > 1) {
      auto offset = aux_node_offset_[0](*e);
      for (unsigned i = 0; i < NumAuxNodes(e->RefEl(), order); ++i) {
        node_indices.push_back(offset + i);
      }
    }

    if (order_ == 1) {
      if (ref_el == base::RefEl::kSegment()) {
        vtk_file_.unstructured_grid.cell_types[index] =
            VtkFile::CellType::VTK_LINE;
      } else if (ref_el == base::RefEl::kTria()) {
        vtk_file_.unstructured_grid.cell_types[index] =
            VtkFile::CellType::VTK_TRIANGLE;
      } else if (ref_el == base::RefEl::kQuad()) {
        vtk_file_.unstructured_grid.cell_types[index] =
            VtkFile::CellType::VTK_QUAD;
      }
    } else {
      switch (ref_el) {
        case base::RefEl::kSegment():
          vtk_file_.unstructured_grid.cell_types[index] =
              VtkFile::CellType::VTK_LAGRANGE_CURVE;
          break;
        case base::RefEl::kTria():
          vtk_file_.unstructured_grid.cell_types[index] =
              VtkFile::CellType::VTK_LAGRANGE_TRIANGLE;
          break;
        case base::RefEl::kQuad():
          vtk_file_.unstructured_grid.cell_types[index] =
              VtkFile::CellType::VTK_LAGRANGE_QUADRILATERAL;
          break;
        default:
          LF_VERIFY_MSG(false, "Unsupported RefElType " << ref_el);
      }
    }
  }
}